

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int copy_from_lzss_window(archive_read *a,void *buffer,int64_t startpos,int length)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  rar *rar;
  int firstpart;
  int windowoffs;
  int length_local;
  int64_t startpos_local;
  void *buffer_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  iVar2 = lzss_offset_for_position((lzss *)((long)pvVar1 + 0x350),startpos);
  iVar3 = lzss_size((lzss *)((long)pvVar1 + 0x350));
  iVar3 = iVar3 - iVar2;
  if (iVar3 < 0) {
    archive_set_error(&a->archive,0x54,"Bad RAR file data");
    a_local._4_4_ = -0x1e;
  }
  else {
    if (iVar3 < length) {
      memcpy(buffer,(void *)(*(long *)((long)pvVar1 + 0x350) + (long)iVar2),(long)iVar3);
      memcpy(buffer,*(void **)((long)pvVar1 + 0x350),(long)(length - iVar3));
    }
    else {
      memcpy(buffer,(void *)(*(long *)((long)pvVar1 + 0x350) + (long)iVar2),(long)length);
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
copy_from_lzss_window(struct archive_read *a, void *buffer,
                      int64_t startpos, int length)
{
  int windowoffs, firstpart;
  struct rar *rar = (struct rar *)(a->format->data);

  windowoffs = lzss_offset_for_position(&rar->lzss, startpos);
  firstpart = lzss_size(&rar->lzss) - windowoffs;
  if (firstpart < 0) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Bad RAR file data");
    return (ARCHIVE_FATAL);
  }
  if (firstpart < length) {
    memcpy(buffer, &rar->lzss.window[windowoffs], firstpart);
    memcpy(buffer, &rar->lzss.window[0], length - firstpart);
  } else {
    memcpy(buffer, &rar->lzss.window[windowoffs], length);
  }
  return (ARCHIVE_OK);
}